

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

bool Debug::getSourceLine(void *addr,String *file,int *line)

{
  int iVar1;
  undefined8 *__ptr;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  usize length;
  String *__nbytes;
  bool bVar5;
  Process process;
  void *relAddr;
  String local_188;
  String addrStr;
  void *addrs [1];
  String cmd;
  String bin;
  String buf;
  
  addrs[0] = addr;
  __ptr = (undefined8 *)backtrace_symbols(addrs,1);
  if (__ptr == (undefined8 *)0x0) {
    return false;
  }
  if ((char *)*__ptr == (char *)0x0) {
    free(__ptr);
    return false;
  }
  String::fromCString(&addrStr,(char *)*__ptr);
  free(__ptr);
  pcVar2 = String::findLast(&addrStr,'[');
  pcVar3 = String::findLast(&addrStr,']');
  bVar5 = false;
  if (((pcVar3 < pcVar2) || (bVar5 = false, pcVar2 == (char *)0x0)) || (pcVar3 == (char *)0x0))
  goto LAB_00102c41;
  pcVar4 = String::operator_cast_to_char_(&addrStr);
  String::substr(&buf,&addrStr,(long)(pcVar2 + 1) - (long)pcVar4,(long)pcVar3 - (long)(pcVar2 + 1));
  iVar1 = String::scanf(&buf,"%p",&relAddr);
  String::~String(&buf);
  if ((iVar1 != 1) || (pcVar2 = String::findLast(&addrStr,'('), pcVar2 == (char *)0x0)) {
    bVar5 = false;
    goto LAB_00102c41;
  }
  pcVar3 = String::operator_cast_to_char_(&addrStr);
  String::substr(&bin,&addrStr,0,(long)pcVar2 - (long)pcVar3);
  pcVar2 = String::operator_cast_to_char_(&bin);
  String::fromPrintf(&cmd,"addr2line -e \"%s\" %p",pcVar2,relAddr);
  Process::Process(&process);
  buf.data = (Data *)&buf._data.ref;
  buf._data.len = 0;
  buf._data.capacity = 0;
  buf._data.ref = (usize)&String::emptyData;
  __nbytes = &buf;
  buf._data.str = (char *)buf.data;
  iVar1 = Process::open(&process,(char *)&cmd,1);
  Map<String,_String>::~Map((Map<String,_String> *)&buf);
  if ((char)iVar1 == '\0') {
    bVar5 = false;
  }
  else {
    buf.data = &String::emptyData.super_Data;
    String::reserve(&buf,0x8000);
    pcVar2 = String::operator_cast_to_char_(&buf);
    length = Process::read(&process,(int)pcVar2,(void *)0x8000,(size_t)__nbytes);
    if ((long)length < 0) {
LAB_00102c11:
      bVar5 = false;
    }
    else {
      String::resize(&buf,length);
      pcVar2 = String::findLast(&buf,':');
      if (pcVar2 == (char *)0x0) goto LAB_00102c11;
      pcVar3 = String::operator_cast_to_char_(&buf);
      String::substr(&local_188,&buf,0,(long)pcVar2 - (long)pcVar3);
      String::operator=(file,&local_188);
      String::~String(&local_188);
      pcVar3 = String::operator_cast_to_char_(&buf);
      String::substr(&local_188,&buf,(ssize)(pcVar2 + (1 - (long)pcVar3)),-1);
      iVar1 = String::scanf(&local_188,"%d",line);
      bVar5 = iVar1 == 1;
      String::~String(&local_188);
    }
    String::~String(&buf);
  }
  Process::~Process(&process);
  String::~String(&cmd);
  String::~String(&bin);
LAB_00102c41:
  String::~String(&addrStr);
  return bVar5;
}

Assistant:

bool Debug::getSourceLine(void* addr, String& file, int& line)
{
#ifdef _WIN32
  typedef BOOL (WINAPI *PSymInitialize)(HANDLE hProcess, PCSTR UserSearchPath, BOOL fInvadeProcess);
  typedef BOOL (WINAPI *PSymGetLineFromAddr64)(HANDLE hProcess, DWORD64 qwAddr, PDWORD pdwDisplacement, PIMAGEHLP_LINE64 Line64);
  static PSymInitialize pSymInitialize = 0;
  static PSymGetLineFromAddr64 pSymGetLineFromAddr64 = 0;
  static bool initialized = false;
  HANDLE hProcess = GetCurrentProcess();
  if(!initialized)
  {
    initialized = true;
    HMODULE hModule = LoadLibrary("Dbghelp.dll");
    if(!hModule)
      return false;
    pSymInitialize = (PSymInitialize)GetProcAddress(hModule, "SymInitialize");
    pSymGetLineFromAddr64 = (PSymGetLineFromAddr64)GetProcAddress(hModule, "SymGetLineFromAddr64");
    if(!pSymInitialize || !pSymGetLineFromAddr64)
      return false;
    if(!pSymInitialize(hProcess, NULL, TRUE))
    {
      pSymGetLineFromAddr64 = 0;
      return false;
    }
  }
  if(!pSymGetLineFromAddr64)
    return false;
  IMAGEHLP_LINE64 ihLine;
  ihLine.SizeOfStruct = sizeof(IMAGEHLP_LINE64);
  DWORD displacement;
  if(!pSymGetLineFromAddr64(hProcess, (DWORD64)addr, &displacement, &ihLine))
    return false;
#ifdef UNICODE
  static wchar_t fileName[MAX_PATH];
  size_t len = mbstowcs(fileName, ihLine.FileName, strlen(ihLine.FileName));
  if(len == -1)
      return false;
  file = String(fileName, len);
#else
  file = String::fromCString(ihLine.FileName);
#endif
  line = ihLine.LineNumber;
  return true;
#else
  void* addrs[1];
  addrs[0] = addr;
  char** addrStrs = backtrace_symbols(addrs, 1);
  if(!addrStrs)
      return false;
  if(!*addrStrs)
  {
      free(addrStrs);
      return false;
  }
  String addrStr = String::fromCString(*addrStrs);
  free(addrStrs);
  const char* addrStart = addrStr.findLast('[');
  const char* addrEnd = addrStr.findLast(']');
  if(!addrStart ||!addrEnd || addrEnd < addrStart)
      return false;
  ++addrStart;
  void* relAddr;
  if(addrStr.substr(addrStart - (const char*)addrStr, addrEnd - addrStart).scanf("%p", &relAddr) != 1)
      return false;
  const char* binaryEnd = addrStr.findLast('(');
  if(!binaryEnd)
      return false;
  String bin = addrStr.substr(0, binaryEnd - (const char*)addrStr);
  String cmd = String::fromPrintf("addr2line -e \"%s\" %p", (const char*)bin, relAddr);
  Process process;
  if(!process.open(cmd))
      return false;
  String buf;
  buf.reserve(1024 * 32);
  ssize i = process.read((char*)buf, 1024 * 32);
  if(i < 0)
    return false;
  buf.resize(i);
  const char* fileEnd = buf.findLast(':');
  if(!fileEnd)
      return false;
  file = buf.substr(0, fileEnd - (const char*)buf);
  if(buf.substr(fileEnd - (const char*)buf + 1).scanf("%d", &line) != 1)
      return false;
  return true;
#endif
}